

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O2

void google::LogToStderr(void)

{
  LogDestination::LogToStderr();
  return;
}

Assistant:

void LogToStderr() {
  LogDestination::LogToStderr();
}